

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseRuleset(Parser *this,StyleRule *styleRule)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  undefined8 in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  bool foundRBrace;
  int semicolonIndex;
  bool foundSemicolon;
  int rewind;
  int declarationStart;
  Declaration decl;
  Selector sel_1;
  Selector sel;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff94;
  int iVar5;
  Parser *this_00;
  byte local_49;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  Selector::Selector((Selector *)0xa3b4de);
  bVar3 = parseSelector((Parser *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (Selector *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar3) {
    QList<QCss::Selector>::append
              ((QList<QCss::Selector> *)in_RDI,
               (parameter_type)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    do {
      bVar3 = test((Parser *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (TokenType)((ulong)in_RDI >> 0x20));
      if (!bVar3) {
        skipSpace(in_RDI);
        bVar3 = next((Parser *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (TokenType)((ulong)in_RDI >> 0x20));
        if (bVar3) {
          iVar1 = in_RDI->index;
          goto LAB_00a3b5f3;
        }
        local_49 = 0;
        break;
      }
      skipSpace(in_RDI);
      Selector::Selector((Selector *)0xa3b562);
      bVar3 = parseNextSelector((Parser *)
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                (Selector *)in_RDI);
      if (bVar3) {
        QList<QCss::Selector>::append
                  ((QList<QCss::Selector> *)in_RDI,
                   (parameter_type)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      }
      else {
        local_49 = 0;
      }
      Selector::~Selector((Selector *)0xa3b5a5);
    } while (bVar3);
  }
  else {
    local_49 = 0;
  }
  goto LAB_00a3b76c;
  while (bVar3 = test((Parser *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (TokenType)((ulong)in_RDI >> 0x20)), bVar3) {
LAB_00a3b5f3:
    skipSpace(in_RDI);
    Declaration::Declaration((Declaration *)in_RDI);
    iVar5 = in_RDI->index;
    bVar3 = parseNextDeclaration
                      ((Parser *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (Declaration *)in_RDI);
    if (bVar3) {
LAB_00a3b6dd:
      bVar3 = Declaration::isEmpty((Declaration *)in_RDI);
      if (!bVar3) {
        QList<QCss::Declaration>::append
                  ((QList<QCss::Declaration> *)in_RDI,
                   (parameter_type)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      }
      bVar3 = false;
    }
    else {
      in_RDI->index = iVar5;
      bVar3 = until(this_00,(TokenType)((ulong)in_RSI >> 0x20),(TokenType)in_RSI);
      uVar4 = (uint)bVar3 << 0x18;
      in_stack_ffffffffffffff8c = in_RDI->index;
      in_RDI->index = iVar1;
      bVar3 = until(this_00,(TokenType)((ulong)in_RSI >> 0x20),(TokenType)in_RSI);
      in_stack_ffffffffffffff88 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff88);
      if (((uVar4 & 0x1000000) != 0) && (in_stack_ffffffffffffff8c < in_RDI->index)) {
        Declaration::Declaration((Declaration *)in_RDI);
        Declaration::operator=
                  ((Declaration *)in_RDI,
                   (Declaration *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        Declaration::~Declaration((Declaration *)0xa3b6ac);
        in_RDI->index = in_stack_ffffffffffffff8c + -1;
        goto LAB_00a3b6dd;
      }
      skipSpace(in_RDI);
      local_49 = (byte)((uint)in_stack_ffffffffffffff88 >> 0x18) & 1;
      bVar3 = true;
    }
    Declaration::~Declaration((Declaration *)0xa3b710);
    if (bVar3) goto LAB_00a3b76c;
  }
  bVar3 = next((Parser *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (TokenType)((ulong)in_RDI >> 0x20));
  if (bVar3) {
    skipSpace(in_RDI);
    local_49 = 1;
  }
  else {
    local_49 = 0;
  }
LAB_00a3b76c:
  Selector::~Selector((Selector *)0xa3b776);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (bool)(local_49 & 1);
}

Assistant:

bool Parser::parseRuleset(StyleRule *styleRule)
{
    Selector sel;
    if (!parseSelector(&sel)) return false;
    styleRule->selectors.append(sel);

    while (test(COMMA)) {
        skipSpace();
        Selector sel;
        if (!parseNextSelector(&sel)) return false;
        styleRule->selectors.append(sel);
    }

    skipSpace();
    if (!next(LBRACE)) return false;
    const int declarationStart = index;

    do {
        skipSpace();
        Declaration decl;
        const int rewind = index;
        if (!parseNextDeclaration(&decl)) {
            index = rewind;
            const bool foundSemicolon = until(SEMICOLON);
            const int semicolonIndex = index;

            index = declarationStart;
            const bool foundRBrace = until(RBRACE);

            if (foundSemicolon && semicolonIndex < index) {
                decl = Declaration();
                index = semicolonIndex - 1;
            } else {
                skipSpace();
                return foundRBrace;
            }
        }
        if (!decl.isEmpty())
            styleRule->declarations.append(decl);
    } while (test(SEMICOLON));

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}